

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

int google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
              (UnknownFieldSet *unknown_fields)

{
  uint uVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  pointer pUVar3;
  int iVar4;
  uint32 value;
  int iVar5;
  long lVar6;
  int iVar7;
  int i;
  long lVar8;
  long lVar9;
  
  lVar9 = 0;
  lVar8 = 0;
  iVar7 = 0;
  while( true ) {
    pvVar2 = unknown_fields->fields_;
    if (pvVar2 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (long)(int)((ulong)((long)(pvVar2->
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar2->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (lVar6 <= lVar8) break;
    pUVar3 = (pvVar2->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = *(uint *)(&pUVar3->field_0x0 + lVar9);
    if ((uVar1 & 0xe0000000) == 0x60000000) {
      iVar4 = io::CodedOutputStream::VarintSize32(uVar1 & 0x1fffffff);
      value = UnknownField::GetLengthDelimitedSize((UnknownField *)(&pUVar3->field_0x0 + lVar9));
      iVar5 = io::CodedOutputStream::VarintSize32(value);
      iVar7 = iVar7 + 4 + value + iVar5 + iVar4;
    }
    lVar8 = lVar8 + 1;
    lVar9 = lVar9 + 0x10;
  }
  return iVar7;
}

Assistant:

int WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  int size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}